

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_delete.cpp
# Opt level: O1

SourceResultType __thiscall
duckdb::PhysicalDelete::GetData
          (PhysicalDelete *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  GlobalSourceState *pGVar1;
  pointer pGVar2;
  long value;
  bool bVar3;
  Value VStack_58;
  
  pGVar1 = input->global_state;
  pGVar2 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalOperator).sink_state);
  if (this->return_chunk == false) {
    chunk->count = 1;
    value = NumericCastImpl<long,_unsigned_long,_false>::Convert
                      ((unsigned_long)
                       pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
                       __data.__list.__prev);
    Value::BIGINT(&VStack_58,value);
    DataChunk::SetValue(chunk,0,0,&VStack_58);
    Value::~Value(&VStack_58);
    bVar3 = true;
  }
  else {
    ColumnDataCollection::Scan
              ((ColumnDataCollection *)
               &pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
                __list.__next,(ColumnDataScanState *)(pGVar1 + 1),chunk);
    bVar3 = chunk->count == 0;
  }
  return bVar3;
}

Assistant:

SourceResultType PhysicalDelete::GetData(ExecutionContext &context, DataChunk &chunk,
                                         OperatorSourceInput &input) const {
	auto &state = input.global_state.Cast<DeleteSourceState>();
	auto &g = sink_state->Cast<DeleteGlobalState>();
	if (!return_chunk) {
		chunk.SetCardinality(1);
		chunk.SetValue(0, 0, Value::BIGINT(NumericCast<int64_t>(g.deleted_count)));
		return SourceResultType::FINISHED;
	}

	g.return_collection.Scan(state.scan_state, chunk);
	return chunk.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}